

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

tuple<bool,_float,_cv::Mat> *
removeCollapsnessIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  _InputArray *p_Var1;
  double dVar2;
  double dVar3;
  double max;
  double min;
  Mat uncollapsed;
  double local_668;
  double local_660;
  _InputArray local_658 [4];
  undefined1 local_5f8 [16];
  Size local_5e8;
  double local_598;
  undefined1 local_590;
  Mat local_588 [96];
  Mat aMStack_528 [144];
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  double local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  MatExpr local_450 [16];
  Mat local_440 [96];
  Mat local_3e0 [96];
  Mat aMStack_380 [144];
  MatExpr local_2f0 [16];
  Mat local_2e0 [96];
  Mat local_280 [96];
  Mat aMStack_220 [144];
  Mat local_190 [16];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  local_5e8.width = 0;
  local_5e8.height = 0;
  local_5f8._0_4_ = 0x1010000;
  local_5f8._8_8_ = inputImg;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::minMaxLoc((_InputArray *)local_5f8,&local_660,&local_668,(Point_ *)0x0,(Point_ *)0x0,p_Var1);
  dVar2 = (local_668 - local_660) + 1.0;
  dVar3 = dVar2 * 0.00390625 * 100.0;
  if (60.0 <= dVar3) {
    cv::Mat::Mat((Mat *)local_5f8,inputImg);
    local_590 = 0;
    local_598 = 100.0 - dVar3;
    cv::Mat::Mat((Mat *)__return_storage_ptr__,(Mat *)local_5f8);
    p_Var1 = (_InputArray *)local_5f8;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl =
         (float)local_598;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = local_590;
  }
  else {
    local_478 = local_660;
    uStack_470 = 0;
    local_468 = 0;
    uStack_460 = 0;
    cv::operator-(local_190,(Scalar_ *)inputImg);
    cv::operator*(local_450,256.0 / dVar2);
    local_488 = 0;
    uStack_480 = 0;
    local_498 = 0;
    uStack_490 = 0;
    cv::operator+(local_2f0,(Scalar_ *)local_450);
    cv::operator*((MatExpr *)local_5f8,1.15);
    cv::Mat::Mat((Mat *)local_658);
    (**(code **)(*(long *)CONCAT44(local_5f8._4_4_,local_5f8._0_4_) + 0x18))
              ((long *)CONCAT44(local_5f8._4_4_,local_5f8._0_4_),local_5f8,local_658,0xffffffff);
    cv::Mat::~Mat(aMStack_528);
    cv::Mat::~Mat(local_588);
    cv::Mat::~Mat((Mat *)(local_5f8 + 0x10));
    cv::Mat::~Mat(aMStack_220);
    cv::Mat::~Mat(local_280);
    cv::Mat::~Mat(local_2e0);
    cv::Mat::~Mat(aMStack_380);
    cv::Mat::~Mat(local_3e0);
    cv::Mat::~Mat(local_440);
    cv::Mat::~Mat(aMStack_c0);
    cv::Mat::~Mat(local_120);
    cv::Mat::~Mat(local_180);
    cv::Mat::Mat((Mat *)local_5f8,(Mat *)local_658);
    local_598 = 100.0 - dVar3;
    local_590 = 1;
    cv::Mat::Mat((Mat *)__return_storage_ptr__,(Mat *)local_5f8);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl =
         (float)local_598;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = local_590;
    cv::Mat::~Mat((Mat *)local_5f8);
    p_Var1 = local_658;
  }
  cv::Mat::~Mat((Mat *)p_Var1);
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeCollapsnessIfPresent(Mat const& inputImg) {
    double min, max;

    minMaxLoc(inputImg, &min,&max);
    double spreadnessPercentage = (((max - min) + 1) / 256) * 100;

    if (spreadnessPercentage < 60) {
        double scalingFactor = 256 / ((max - min) + 1);
        double a = 0, c = min;
        Mat uncollapsed = ((inputImg - c) * (scalingFactor) + a)  * 1.15;
        return make_tuple(true, (100 - spreadnessPercentage), uncollapsed);
    }
    return make_tuple(false,(100 - spreadnessPercentage),inputImg);
}